

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

Error asmjit::Inst::validate(uint32_t archType,Detail *detail,Operand_ *operands,uint32_t count)

{
  uint in_EDI;
  uint32_t in_stack_00000154;
  Operand_ *in_stack_00000158;
  Detail *in_stack_00000160;
  uint32_t in_stack_00000168;
  bool local_25;
  Error local_c;
  
  local_25 = in_EDI == 0 || 3 < in_EDI;
  if (local_25) {
    local_c = 5;
  }
  else {
    local_c = X86InstImpl::validate
                        (in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000154);
  }
  return local_c;
}

Assistant:

Error Inst::validate(uint32_t archType, const Detail& detail, const Operand_* operands, uint32_t count) noexcept {
  #if defined(ASMJIT_BUILD_X86)
  if (ArchInfo::isX86Family(archType))
    return X86InstImpl::validate(archType, detail, operands, count);
  #endif

  #if defined(ASMJIT_BUILD_ARM)
  if (ArchInfo::isArmFamily(archType))
    return ArmInstImpl::validate(archType, detail, operands, count);
  #endif

  return DebugUtils::errored(kErrorInvalidArch);
}